

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FunctionStatement *func_stmt,void *data)

{
  pointer pSVar1;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_RDI;
  FunctionBody *body;
  FunctionNameData name_data;
  FunctionNameData local_19 [25];
  
  FunctionNameData::FunctionNameData(local_19);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x192435);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_19);
  if ((local_19[0].has_member_token_ & 1U) != 0) {
    pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get(in_RDI);
    *(undefined1 *)&pSVar1[3]._vptr_SyntaxTree = 1;
  }
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x192479);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FunctionStatement *func_stmt, void *data)
    {
        FunctionNameData name_data;
        func_stmt->func_name_->Accept(this, &name_data);

        // Set FunctionBody has 'self' param when FunctionName has member token
        if (name_data.has_member_token_)
        {
            auto body = static_cast<FunctionBody *>(func_stmt->func_body_.get());
            body->has_self_ = true;
        }

        func_stmt->func_body_->Accept(this, nullptr);
    }